

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O1

void sexp_init_context_globals(sexp ctx)

{
  sexp_proc1 f;
  sexp psVar1;
  sexp_mark_stack_ptr_t *psVar2;
  int *piVar3;
  sexp psVar4;
  long lVar5;
  sexp_sint_t in_RDX;
  sexp_sint_t n;
  sexp extraout_RDX;
  sexp n_00;
  char *str;
  undefined8 *puVar6;
  int *piVar7;
  long lVar8;
  char **ppcVar9;
  byte bVar10;
  sexp feature;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp local_50;
  sexp_gc_var_t local_48;
  
  bVar10 = 0;
  local_50 = (sexp)&DAT_0000043e;
  local_48.var = (sexp_conflict *)0x0;
  local_48.next = (sexp_gc_var_t *)0x0;
  psVar1 = sexp_make_vector_op(ctx,(sexp)0x0,in_RDX,(sexp)&DAT_0000006b,(sexp)&DAT_0000043e);
  (ctx->value).type.setters = psVar1;
  psVar1 = sexp_make_vector_op(ctx,(sexp)0x0,n,(sexp)&DAT_0000030b,(sexp)&DAT_0000023e);
  (((ctx->value).type.setters)->value).type.cpl = psVar1;
  (((ctx->value).type.setters)->value).context.mark_stack[6].start = (sexp_conflict *)0x3e;
  (((ctx->value).type.setters)->value).context.mark_stack[6].end = (sexp_conflict *)0x3e;
  (((ctx->value).type.setters)->value).context.mark_stack[6].prev = (sexp_mark_stack_ptr_t *)0x3e;
  (((ctx->value).type.setters)->value).context.mark_stack[8].start = (sexp_conflict *)0x23e;
  (((ctx->value).type.setters)->value).context.mark_stack[7].start = (sexp_conflict *)0x3e;
  (((ctx->value).type.setters)->value).context.mark_stack[7].end = (sexp_conflict *)0x3e;
  (((ctx->value).type.setters)->value).context.mark_stack[7].prev = (sexp_mark_stack_ptr_t *)0x1;
  psVar1 = sexp_user_exception(ctx,(sexp)&DAT_0000003e,"out of memory",(sexp)&DAT_0000023e);
  (((ctx->value).type.setters)->value).type.print = psVar1;
  psVar1 = sexp_user_exception(ctx,(sexp)&DAT_0000003e,"out of stack space",(sexp)&DAT_0000023e);
  (((ctx->value).type.setters)->value).type.dl = psVar1;
  psVar1 = sexp_user_exception(ctx,(sexp)&DAT_0000003e,"incompatible ABI",(sexp)&DAT_0000023e);
  (((ctx->value).type.setters)->value).type.finalize_name = psVar1;
  psVar1 = sexp_user_exception(ctx,(sexp)&DAT_0000003e,"interrupt",(sexp)&DAT_0000023e);
  (((ctx->value).type.setters)->value).opcode.methods = psVar1;
  psVar1 = sexp_intern(ctx,"quote",-1);
  (((ctx->value).type.setters)->value).context.mark_stack[0].start = (sexp_conflict *)psVar1;
  psVar1 = sexp_intern(ctx,"quasiquote",-1);
  (((ctx->value).type.setters)->value).context.mark_stack[0].end = (sexp_conflict *)psVar1;
  psVar1 = sexp_intern(ctx,"unquote",-1);
  (((ctx->value).type.setters)->value).context.mark_stack[0].prev = (sexp_mark_stack_ptr_t *)psVar1;
  psVar1 = sexp_intern(ctx,"unquote-splicing",-1);
  (((ctx->value).type.setters)->value).context.mark_stack[1].start = (sexp_conflict *)psVar1;
  psVar1 = sexp_intern(ctx,"syntax",-1);
  (((ctx->value).type.setters)->value).context.mark_stack[1].end = (sexp_conflict *)psVar1;
  psVar1 = sexp_intern(ctx,"quasisyntax",-1);
  (((ctx->value).type.setters)->value).context.mark_stack[1].prev = (sexp_mark_stack_ptr_t *)psVar1;
  psVar1 = sexp_intern(ctx,"unsyntax",-1);
  (((ctx->value).type.setters)->value).context.mark_stack[2].start = (sexp_conflict *)psVar1;
  psVar1 = sexp_intern(ctx,"unsyntax-splicing",-1);
  (((ctx->value).type.setters)->value).context.mark_stack[2].end = (sexp_conflict *)psVar1;
  psVar1 = sexp_intern(ctx,"current-input-port",-1);
  (((ctx->value).type.setters)->value).context.mark_stack[3].start = (sexp_conflict *)psVar1;
  psVar1 = sexp_intern(ctx,"current-output-port",-1);
  (((ctx->value).type.setters)->value).context.mark_stack[3].end = (sexp_conflict *)psVar1;
  psVar1 = sexp_intern(ctx,"current-error-port",-1);
  (((ctx->value).type.setters)->value).context.mark_stack[3].prev = (sexp_mark_stack_ptr_t *)psVar1;
  psVar1 = sexp_intern(ctx,"interaction-environment",-1);
  (((ctx->value).type.setters)->value).context.mark_stack[4].start = (sexp_conflict *)psVar1;
  psVar1 = sexp_intern(ctx,"continuable",-1);
  (((ctx->value).type.setters)->value).context.mark_stack[4].end = (sexp_conflict *)psVar1;
  psVar2 = (sexp_mark_stack_ptr_t *)sexp_alloc(ctx,0x10);
  if ((psVar2 != (sexp_mark_stack_ptr_t *)0x0) &&
     ((((ulong)psVar2 & 3) != 0 || (*(int *)&psVar2->start != 0x13)))) {
    *(undefined4 *)&psVar2->start = 10;
  }
  (((ctx->value).type.setters)->value).context.mark_stack[2].prev = psVar2;
  ((((ctx->value).type.setters)->value).context.mark_stack[2].prev)->end = (sexp_conflict *)0x0;
  (((ctx->value).type.setters)->value).bytecode.max_depth = 0x23e;
  sexp_push_op(ctx,&(((ctx->value).type.setters)->value).type.setters,(sexp)&DAT_0000003e);
  psVar1 = sexp_intern(ctx,"little-endian",-1);
  (((((ctx->value).type.setters)->value).type.setters)->value).type.name = psVar1;
  psVar1 = sexp_intern(ctx,"little",-1);
  (((ctx->value).type.setters)->value).type.slots = psVar1;
  local_48.var = &local_50;
  local_48.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_48;
  ppcVar9 = sexp_initial_features;
  str = "x86_64";
  do {
    local_50 = sexp_intern(ctx,str,-1);
    psVar1 = (ctx->value).type.setters;
    psVar4 = (psVar1->value).type.setters;
    if (((ulong)psVar4 & 3) == 0) {
      do {
        n_00 = (sexp)&DAT_0000003e;
        if ((psVar4->tag != 6) || (n_00 = psVar4, (psVar4->value).type.name == local_50)) break;
        psVar4 = (psVar4->value).type.cpl;
        n_00 = (sexp)&DAT_0000003e;
      } while (((ulong)psVar4 & 3) == 0);
      if (n_00 == (sexp)&DAT_0000003e) goto LAB_0010f12f;
    }
    else {
LAB_0010f12f:
      sexp_push_op(ctx,&(psVar1->value).type.setters,(sexp)&DAT_0000003e);
      (((((ctx->value).type.setters)->value).type.setters)->value).type.name = local_50;
      n_00 = extraout_RDX;
    }
    str = ppcVar9[1];
    ppcVar9 = ppcVar9 + 1;
    if (str == (char *)0x0) {
      (ctx->value).context.saves = local_48.next;
      (((ctx->value).type.setters)->value).type.id = (sexp)0x53;
      lVar8 = 0;
      psVar1 = sexp_make_vector_op(ctx,(sexp)0x0,(sexp_sint_t)n_00,(sexp)&DAT_000000a5,
                                   (sexp)&DAT_0000043e);
      (((ctx->value).type.setters)->value).type.getters = psVar1;
      ppcVar9 = &((((ctx->value).type.setters)->value).port.stream)->_IO_read_end;
      psVar1 = (sexp)0x0;
      while( true ) {
        piVar3 = (int *)sexp_alloc(ctx,0x78);
        if (piVar3 == (int *)0x0) {
          return;
        }
        if ((((ulong)piVar3 & 3) != 0) || (*piVar3 != 0x13)) {
          *piVar3 = 1;
        }
        if (piVar3 == (int *)0x0) break;
        puVar6 = (undefined8 *)((long)&_sexp_type_specs[0].name + lVar8);
        piVar7 = piVar3 + 2;
        for (lVar5 = 0xe; lVar5 != 0; lVar5 = lVar5 + -1) {
          *(undefined8 *)piVar7 = *puVar6;
          puVar6 = puVar6 + (ulong)bVar10 * -2 + 1;
          piVar7 = piVar7 + (ulong)bVar10 * -4 + 2;
        }
        *ppcVar9 = (char *)piVar3;
        psVar4 = sexp_c_string(ctx,*(char **)(piVar3 + 2),-1);
        *(sexp *)(piVar3 + 2) = psVar4;
        if (*(char **)(piVar3 + 0x12) != (char *)0x0) {
          psVar4 = sexp_c_string(ctx,*(char **)(piVar3 + 0x12),-1);
          *(sexp *)(piVar3 + 0x12) = psVar4;
        }
        f = *(sexp_proc1 *)(piVar3 + 0xe);
        if (f != (sexp_proc1)0x0) {
          if ((psVar1 == (sexp)0x0) || (f != (psVar1->value).opcode.func)) {
            psVar1 = sexp_make_foreign(ctx,"sexp_write_simple_object",3,0,(char *)0x0,f,(sexp)0x0);
          }
          *(sexp *)(piVar3 + 0xe) = psVar1;
        }
        ppcVar9 = ppcVar9 + 1;
        lVar8 = lVar8 + 0x70;
        if (lVar8 == 0x11f0) {
          return;
        }
      }
      return;
    }
  } while( true );
}

Assistant:

void sexp_init_context_globals (sexp ctx) {
  const char** features;
  int i, endianess_check = 1;
  sexp type, *vec, print=NULL;
  sexp_gc_var1(feature);
  sexp_context_globals(ctx)
    = sexp_make_vector(ctx, sexp_make_fixnum(SEXP_G_NUM_GLOBALS), SEXP_VOID);
#if ! SEXP_USE_GLOBAL_SYMBOLS
  sexp_global(ctx, SEXP_G_SYMBOLS) = sexp_make_vector(ctx, sexp_make_fixnum(SEXP_SYMBOL_TABLE_SIZE), SEXP_NULL);
#endif
  sexp_global(ctx, SEXP_G_STRICT_P) = SEXP_FALSE;
  sexp_global(ctx, SEXP_G_NO_TAIL_CALLS_P) = SEXP_FALSE;
#if SEXP_USE_FOLD_CASE_SYMS
  sexp_global(ctx, SEXP_G_FOLD_CASE_P) = sexp_make_boolean(SEXP_DEFAULT_FOLD_CASE_SYMS);
#endif
#if ! SEXP_USE_BOEHM
  sexp_global(ctx, SEXP_G_PRESERVATIVES) = SEXP_NULL;
#endif
#if SEXP_USE_WEAK_REFERENCES
  sexp_global(ctx, SEXP_G_WEAK_OBJECTS_PRESENT) = SEXP_FALSE;
  sexp_global(ctx, SEXP_G_FILE_DESCRIPTORS) = SEXP_FALSE;
  sexp_global(ctx, SEXP_G_NUM_FILE_DESCRIPTORS) = SEXP_ZERO;
#endif
  sexp_global(ctx, SEXP_G_OOM_ERROR) = sexp_user_exception(ctx, SEXP_FALSE, "out of memory", SEXP_NULL);
  sexp_global(ctx, SEXP_G_OOS_ERROR) = sexp_user_exception(ctx, SEXP_FALSE, "out of stack space", SEXP_NULL);
  sexp_global(ctx, SEXP_G_ABI_ERROR) = sexp_user_exception(ctx, SEXP_FALSE, "incompatible ABI", SEXP_NULL);
  sexp_global(ctx, SEXP_G_INTERRUPT_ERROR) = sexp_user_exception(ctx, SEXP_FALSE, "interrupt", SEXP_NULL);
  sexp_global(ctx, SEXP_G_QUOTE_SYMBOL) = sexp_intern(ctx, "quote", -1);
  sexp_global(ctx, SEXP_G_QUASIQUOTE_SYMBOL) = sexp_intern(ctx, "quasiquote", -1);
  sexp_global(ctx, SEXP_G_UNQUOTE_SYMBOL) = sexp_intern(ctx, "unquote", -1);
  sexp_global(ctx, SEXP_G_UNQUOTE_SPLICING_SYMBOL) = sexp_intern(ctx, "unquote-splicing", -1);
  sexp_global(ctx, SEXP_G_SYNTAX_SYMBOL) = sexp_intern(ctx, "syntax", -1);
  sexp_global(ctx, SEXP_G_QUASISYNTAX_SYMBOL) = sexp_intern(ctx, "quasisyntax", -1);
  sexp_global(ctx, SEXP_G_UNSYNTAX_SYMBOL) = sexp_intern(ctx, "unsyntax", -1);
  sexp_global(ctx, SEXP_G_UNSYNTAX_SPLICING_SYMBOL) = sexp_intern(ctx, "unsyntax-splicing", -1);
  sexp_global(ctx, SEXP_G_CUR_IN_SYMBOL) = sexp_intern(ctx, "current-input-port", -1);
  sexp_global(ctx, SEXP_G_CUR_OUT_SYMBOL) = sexp_intern(ctx, "current-output-port", -1);
  sexp_global(ctx, SEXP_G_CUR_ERR_SYMBOL) = sexp_intern(ctx, "current-error-port", -1);
  sexp_global(ctx, SEXP_G_INTERACTION_ENV_SYMBOL) = sexp_intern(ctx, "interaction-environment", -1);
  sexp_global(ctx, SEXP_G_CONTINUABLE_SYMBOL) = sexp_intern(ctx, "continuable", -1);
  sexp_global(ctx, SEXP_G_EMPTY_VECTOR) = sexp_alloc_type(ctx, vector, SEXP_VECTOR);
  sexp_vector_length(sexp_global(ctx, SEXP_G_EMPTY_VECTOR)) = 0;
  sexp_global(ctx, SEXP_G_FEATURES) = SEXP_NULL;
  sexp_push(ctx, sexp_global(ctx, SEXP_G_FEATURES), SEXP_FALSE);
  sexp_car(sexp_global(ctx, SEXP_G_FEATURES)) = sexp_intern(ctx, (*(unsigned char*) &endianess_check) ? "little-endian" : "big-endian", -1);
  sexp_global(ctx, SEXP_G_ENDIANNESS) = sexp_intern(ctx, (*(unsigned char*) &endianess_check) ? "little" : "big", -1);
  sexp_gc_preserve1(ctx, feature);
  for (features=sexp_initial_features; *features; features++) {
    feature = sexp_intern(ctx, *features, -1);
    if (sexp_not(sexp_memq(ctx, feature, sexp_global(ctx, SEXP_G_FEATURES)))) {
      sexp_push(ctx, sexp_global(ctx, SEXP_G_FEATURES), SEXP_FALSE);
      sexp_car(sexp_global(ctx, SEXP_G_FEATURES)) = feature;
    }
  }
  sexp_gc_release1(ctx);
  sexp_global(ctx, SEXP_G_NUM_TYPES) = sexp_make_fixnum(SEXP_NUM_CORE_TYPES);
  sexp_global(ctx, SEXP_G_TYPES)
    = sexp_make_vector(ctx, sexp_make_fixnum(SEXP_INIT_NUM_TYPES), SEXP_VOID);
  vec = sexp_vector_data(sexp_global(ctx, SEXP_G_TYPES));
  for (i=0; i<SEXP_NUM_CORE_TYPES; i++) {
    type = sexp_alloc_type(ctx, type, SEXP_TYPE);
    if (!type) {
      return; /* TODO - fundamental OOM, what to do here? */
    }
    memcpy(&(type->value), &(_sexp_type_specs[i]), sizeof(_sexp_type_specs[0]));
    vec[i] = type;
    sexp_type_name(type) = sexp_c_string(ctx, (char*)sexp_type_name(type), -1);
    if (sexp_type_finalize_name(type)) {
      sexp_type_finalize_name(type) = sexp_c_string(ctx, (char*)sexp_type_finalize_name(type), -1);
    }
    if (sexp_type_print(type)) {
      if (print && ((sexp_proc1)sexp_type_print(type) == sexp_opcode_func(print)))
        sexp_type_print(type) = print;
      else
        sexp_type_print(type) = print = sexp_make_foreign(ctx, "sexp_write_simple_object", 3, 0, NULL, (sexp_proc1)sexp_type_print(type), NULL);
    }
  }
}